

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O0

void __thiscall CodeGenerator::writeResources(CodeGenerator *this,ostream *s,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  reference pRVar3;
  void *this_00;
  undefined1 local_120 [8];
  Resource i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Resource,_std::allocator<Resource>_> *__range1_1;
  undefined1 local_98 [8];
  Resource i;
  iterator __end1;
  iterator __begin1;
  vector<Resource,_std::allocator<Resource>_> *__range1;
  Class *clazz_local;
  ostream *s_local;
  CodeGenerator *this_local;
  
  poVar2 = std::operator<<(s,"    // resources");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Resource,_std::allocator<Resource>_>::begin(&clazz->resources);
  i.initializer.field_2._8_8_ =
       std::vector<Resource,_std::allocator<Resource>_>::end(&clazz->resources);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Resource_*,_std::vector<Resource,_std::allocator<Resource>_>_>
                                *)((long)&i.initializer.field_2 + 8));
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<Resource_*,_std::vector<Resource,_std::allocator<Resource>_>_>::
             operator*(&__end1);
    Resource::Resource((Resource *)local_98,pRVar3);
    poVar2 = std::operator<<(s,"    ");
    poVar2 = std::operator<<(poVar2,(string *)local_98);
    poVar2 = std::operator<<(poVar2," *");
    poVar2 = std::operator<<(poVar2,(string *)(i.type.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2," = nullptr;");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Resource::~Resource((Resource *)local_98);
    __gnu_cxx::__normal_iterator<Resource_*,_std::vector<Resource,_std::allocator<Resource>_>_>::
    operator++(&__end1);
  }
  poVar2 = (ostream *)std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"    void initResources(rengine::ResourceManager *manager) {");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::vector<Resource,_std::allocator<Resource>_>::begin(&clazz->resources);
  i_1.initializer.field_2._8_8_ =
       std::vector<Resource,_std::allocator<Resource>_>::end(&clazz->resources);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Resource_*,_std::vector<Resource,_std::allocator<Resource>_>_>
                        *)((long)&i_1.initializer.field_2 + 8));
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<Resource_*,_std::vector<Resource,_std::allocator<Resource>_>_>::
             operator*(&__end1_1);
    Resource::Resource((Resource *)local_120,pRVar3);
    poVar2 = std::operator<<(s,"        ");
    poVar2 = std::operator<<(poVar2,(string *)(i_1.type.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2," = manager->acquire<");
    poVar2 = std::operator<<(poVar2,(string *)local_120);
    poVar2 = std::operator<<(poVar2,">(\"");
    poVar2 = std::operator<<(poVar2,(string *)(i_1.name.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2,"\");");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Resource::~Resource((Resource *)local_120);
    __gnu_cxx::__normal_iterator<Resource_*,_std::vector<Resource,_std::allocator<Resource>_>_>::
    operator++(&__end1_1);
  }
  poVar2 = std::operator<<(s,"    }");
  this_00 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CodeGenerator::writeResources(std::ostream &s, Class *clazz)
{
    s << "    // resources" << std::endl;
    for (auto i : clazz->resources) {
        s << "    " << i.type << " *" << i.name << " = nullptr;" << std::endl;
    }
    s << std::endl
      << "    void initResources(rengine::ResourceManager *manager) {" << std::endl;
    for (auto i : clazz->resources) {
        s << "        " << i.name << " = manager->acquire<" << i.type << ">(\"" << i.initializer << "\");" << std::endl;
    }
    s << "    }" << std::endl
      << std::endl;
}